

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O0

void __thiscall irr::scene::ISceneNode::removeAll(ISceneNode *this)

{
  bool bVar1;
  reference ppIVar2;
  IReferenceCounted *in_RDI;
  ISceneNode **child;
  iterator __end2;
  iterator __begin2;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *__range2;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
  *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18;
  _List_node_base **local_10;
  
  local_10 = (_List_node_base **)&in_RDI[6].DebugName;
  local_18._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
       begin((list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)in_RDI);
  local_20._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
       end((list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)in_RDI);
  while( true ) {
    bVar1 = ::std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppIVar2 = ::std::_List_iterator<irr::scene::ISceneNode_*>::operator*
                        ((_List_iterator<irr::scene::ISceneNode_*> *)0x2c11aa);
    (*ppIVar2)->Parent = (ISceneNode *)0x0;
    ::std::optional<std::_List_iterator<irr::scene::ISceneNode_*>_>::operator=
              (&(*ppIVar2)->ThisIterator);
    IReferenceCounted::drop(in_RDI);
    ::std::_List_iterator<irr::scene::ISceneNode_*>::operator++(&local_18);
  }
  ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::clear
            (in_stack_ffffffffffffffd0);
  return;
}

Assistant:

virtual void removeAll()
	{
		for (auto &child : Children) {
			child->Parent = nullptr;
			child->ThisIterator = std::nullopt;
			child->drop();
		}
		Children.clear();
	}